

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

void immutable::rrb_details::ensure_size_table_editable<char,false,5>
               (ref<immutable::rrb_details::rrb_size_table<false>_> *table,uint32_t len,
               guid_type guid)

{
  rrb_size_table<false> *prVar1;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_20;
  guid_type local_18;
  uint32_t local_14;
  guid_type guid_local;
  uint32_t len_local;
  ref<immutable::rrb_details::rrb_size_table<false>_> *table_local;
  
  local_18 = guid;
  local_14 = len;
  _guid_local = table;
  prVar1 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(table);
  if (prVar1->guid != local_18) {
    prVar1 = transient_size_table_clone<5,false>(_guid_local->ptr,local_14,local_18);
    ref<immutable::rrb_details::rrb_size_table<false>_>::ref(&local_20,prVar1);
    ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(_guid_local,&local_20);
    ref<immutable::rrb_details::rrb_size_table<false>_>::~ref(&local_20);
  }
  return;
}

Assistant:

inline void ensure_size_table_editable(ref<rrb_size_table<atomic_ref_counting>>& table, uint32_t len, guid_type guid)
      {
      if (table->guid != guid)
        {
        table = transient_size_table_clone<N>(table.ptr, len, guid);
        }
      }